

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlDtdPtr xmlCopyDtd(xmlDtdPtr dtd)

{
  int iVar1;
  xmlDtdPtr dtd_00;
  xmlEntitiesTablePtr pxVar2;
  xmlNotationTablePtr pxVar3;
  xmlElementTablePtr pxVar4;
  xmlAttributeTablePtr pxVar5;
  xmlAttributePtr pxVar6;
  _xmlNode **pp_Var7;
  xmlHashTablePtr table;
  xmlAttributePtr pxVar8;
  xmlAttributePtr tmp;
  _xmlNode *node;
  xmlDtdPtr pxVar9;
  
  if (dtd == (xmlDtdPtr)0x0) {
    pxVar9 = (xmlDtdPtr)0x0;
  }
  else {
    dtd_00 = xmlNewDtd((xmlDocPtr)0x0,dtd->name,dtd->ExternalID,dtd->SystemID);
    pxVar9 = (xmlDtdPtr)0x0;
    if (dtd_00 != (xmlDtdPtr)0x0) {
      if ((xmlEntitiesTablePtr)dtd->entities != (xmlEntitiesTablePtr)0x0) {
        pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->entities);
        dtd_00->entities = pxVar2;
      }
      if ((xmlNotationTablePtr)dtd->notations != (xmlNotationTablePtr)0x0) {
        pxVar3 = xmlCopyNotationTable((xmlNotationTablePtr)dtd->notations);
        dtd_00->notations = pxVar3;
      }
      if ((xmlElementTablePtr)dtd->elements != (xmlElementTablePtr)0x0) {
        pxVar4 = xmlCopyElementTable((xmlElementTablePtr)dtd->elements);
        dtd_00->elements = pxVar4;
      }
      if ((xmlAttributeTablePtr)dtd->attributes != (xmlAttributeTablePtr)0x0) {
        pxVar5 = xmlCopyAttributeTable((xmlAttributeTablePtr)dtd->attributes);
        dtd_00->attributes = pxVar5;
      }
      if ((xmlEntitiesTablePtr)dtd->pentities != (xmlEntitiesTablePtr)0x0) {
        pxVar2 = xmlCopyEntitiesTable((xmlEntitiesTablePtr)dtd->pentities);
        dtd_00->pentities = pxVar2;
      }
      node = dtd->children;
      pxVar9 = dtd_00;
      if (node != (_xmlNode *)0x0) {
        pxVar8 = (xmlAttributePtr)0x0;
        do {
          pxVar6 = (xmlAttributePtr)0x0;
          switch(node->type) {
          case XML_COMMENT_NODE:
            pxVar6 = (xmlAttributePtr)xmlStaticCopyNode(node,(xmlDocPtr)0x0,(xmlNodePtr)0x0,0);
            break;
          case XML_ELEMENT_DECL:
            pxVar6 = (xmlAttributePtr)
                     xmlGetDtdQElementDesc(dtd_00,node->name,(xmlChar *)node->nsDef);
            break;
          case XML_ATTRIBUTE_DECL:
            pxVar6 = xmlGetDtdQAttrDesc(dtd_00,*(xmlChar **)&node->line,node->name,
                                        (xmlChar *)node->psvi);
            break;
          case XML_ENTITY_DECL:
            iVar1 = *(int *)((long)&node->properties + 4);
            if (iVar1 - 1U < 3) {
              table = (xmlHashTablePtr)dtd_00->entities;
LAB_0018a878:
              if (table != (xmlHashTablePtr)0x0) {
                pxVar6 = (xmlAttributePtr)xmlHashLookup(table,node->name);
                break;
              }
            }
            else if (iVar1 - 4U < 2) {
              table = (xmlHashTablePtr)dtd_00->pentities;
              goto LAB_0018a878;
            }
            pxVar6 = (xmlAttributePtr)0x0;
          }
          if (pxVar6 == (xmlAttributePtr)0x0) {
            node = node->next;
            pxVar6 = pxVar8;
          }
          else {
            pp_Var7 = &pxVar8->next;
            if (pxVar8 == (xmlAttributePtr)0x0) {
              pp_Var7 = &dtd_00->children;
            }
            *pp_Var7 = (_xmlNode *)pxVar6;
            pxVar6->prev = (_xmlNode *)pxVar8;
            pxVar6->parent = dtd_00;
            pxVar6->next = (_xmlNode *)0x0;
            dtd_00->last = (_xmlNode *)pxVar6;
            node = node->next;
          }
          pxVar8 = pxVar6;
        } while (node != (_xmlNode *)0x0);
      }
    }
  }
  return pxVar9;
}

Assistant:

xmlDtdPtr
xmlCopyDtd(xmlDtdPtr dtd) {
    xmlDtdPtr ret;
    xmlNodePtr cur, p = NULL, q;

    if (dtd == NULL) return(NULL);
    ret = xmlNewDtd(NULL, dtd->name, dtd->ExternalID, dtd->SystemID);
    if (ret == NULL) return(NULL);
    if (dtd->entities != NULL)
        ret->entities = (void *) xmlCopyEntitiesTable(
	                    (xmlEntitiesTablePtr) dtd->entities);
    if (dtd->notations != NULL)
        ret->notations = (void *) xmlCopyNotationTable(
	                    (xmlNotationTablePtr) dtd->notations);
    if (dtd->elements != NULL)
        ret->elements = (void *) xmlCopyElementTable(
	                    (xmlElementTablePtr) dtd->elements);
    if (dtd->attributes != NULL)
        ret->attributes = (void *) xmlCopyAttributeTable(
	                    (xmlAttributeTablePtr) dtd->attributes);
    if (dtd->pentities != NULL)
	ret->pentities = (void *) xmlCopyEntitiesTable(
			    (xmlEntitiesTablePtr) dtd->pentities);

    cur = dtd->children;
    while (cur != NULL) {
	q = NULL;

	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr tmp = (xmlEntityPtr) cur;
	    switch (tmp->etype) {
		case XML_INTERNAL_GENERAL_ENTITY:
		case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
		case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
		    q = (xmlNodePtr) xmlGetEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PARAMETER_ENTITY:
		case XML_EXTERNAL_PARAMETER_ENTITY:
		    q = (xmlNodePtr)
			xmlGetParameterEntityFromDtd(ret, tmp->name);
		    break;
		case XML_INTERNAL_PREDEFINED_ENTITY:
		    break;
	    }
	} else if (cur->type == XML_ELEMENT_DECL) {
	    xmlElementPtr tmp = (xmlElementPtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQElementDesc(ret, tmp->name, tmp->prefix);
	} else if (cur->type == XML_ATTRIBUTE_DECL) {
	    xmlAttributePtr tmp = (xmlAttributePtr) cur;
	    q = (xmlNodePtr)
		xmlGetDtdQAttrDesc(ret, tmp->elem, tmp->name, tmp->prefix);
	} else if (cur->type == XML_COMMENT_NODE) {
	    q = xmlCopyNode(cur, 0);
	}

	if (q == NULL) {
	    cur = cur->next;
	    continue;
	}

	if (p == NULL)
	    ret->children = q;
	else
	    p->next = q;

	q->prev = p;
	q->parent = (xmlNodePtr) ret;
	q->next = NULL;
	ret->last = q;
	p = q;
	cur = cur->next;
    }

    return(ret);
}